

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void set_hero_route_force(tgestate_t *state,route_t *route)

{
  undefined2 *in_RSI;
  long in_RDI;
  vischar_t *vischar;
  
  *(byte *)(in_RDI + 0x3c1) = *(byte *)(in_RDI + 0x3c1) & 0xbf;
  *(undefined2 *)(in_RDI + 0x3c2) = *in_RSI;
  set_route(state,(vischar_t *)route);
  return;
}

Assistant:

void set_hero_route_force(tgestate_t *state, const route_t *route)
{
  vischar_t *vischar; /* was HL */

  assert(state != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = &state->vischars[0];

  vischar->flags &= ~vischar_FLAGS_TARGET_IS_DOOR;
  vischar->route = *route;
  set_route(state, vischar);
}